

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

PrimMeta * __thiscall tinyusdz::Prim::metas(Prim *this)

{
  PrimMeta *p;
  Prim *this_local;
  
  this_local = (Prim *)anon_unknown_237::GetPrimMeta(&this->_data);
  if ((PrimMeta *)this_local == (PrimMeta *)0x0) {
    this_local = (Prim *)EmptyStaticMeta::GetEmptyStaticMeta();
  }
  return (PrimMeta *)this_local;
}

Assistant:

PrimMeta &Prim::metas() {
  PrimMeta *p = GetPrimMeta(_data);
  if (p) {
    return *p;
  }

  // TODO: This should not happen. report an error.
  return EmptyStaticMeta::GetEmptyStaticMeta();
}